

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_shr_s32(c_v256 *__return_storage_ptr__,c_v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  c_v256 cVar3;
  c_v256 *extraout_RAX;
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [32];
  
  auVar4 = in_ZMM0._0_32_;
  if (c < 0x20) {
    auVar1 = vshufps_avx((undefined1  [16])a.v128[0],(undefined1  [16])a.v128[1],0xdd);
    auVar2 = vshufps_avx((undefined1  [16])a.v128[0],(undefined1  [16])a.v128[1],0x88);
    auVar1 = vpsrad_avx(auVar1,ZEXT416(c));
    auVar2 = vpsrad_avx(auVar2,ZEXT416(c));
    auVar4 = vpmovzxdq_avx2(auVar1);
    auVar5 = vpsllq_avx2(auVar4,0x20);
    auVar4 = vpmovzxdq_avx2(auVar2);
    cVar3 = (c_v256)vpblendd_avx2(auVar4,auVar5,0xaa);
    *__return_storage_ptr__ = cVar3;
    return __return_storage_ptr__;
  }
  c_v256_shr_s32();
  vpsrad_avx2(auVar4,ZEXT416(c));
  return extraout_RAX;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shr_s32(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shr_s32(a.v128[1], c),
                          c_v128_shr_s32(a.v128[0], c));
}